

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# read.c
# Opt level: O1

wchar_t * el_wgets(EditLine *el,wchar_t *nread)

{
  wchar_t **ppwVar1;
  wchar_t *pwVar2;
  bool bVar3;
  bool bVar4;
  el_action_t eVar5;
  wchar_t wVar6;
  int iVar7;
  wchar_t wVar8;
  wchar_t *pwVar9;
  byte bVar10;
  undefined1 uVar11;
  wchar_t ch;
  wchar_t nrb;
  wchar_t local_4c;
  wchar_t *local_48;
  keymacro_value_t local_40;
  wchar_t local_34;
  
  pwVar9 = &local_34;
  if (nread != (wchar_t *)0x0) {
    pwVar9 = nread;
  }
  *pwVar9 = L'\0';
  el->el_read->read_errno = L'\0';
  if ((el->el_flags & 2U) == 0) {
    if ((el->el_flags & 8U) == 0) {
      read_prepare(el);
    }
    if ((el->el_flags & 4U) == 0) {
      bVar10 = 0;
      local_48 = pwVar9;
switchD_0010dc9c_caseD_3:
      do {
        do {
          wVar6 = el_wgetc(el,&local_4c);
          bVar3 = true;
          if (wVar6 == L'\x01') {
            if ((el->el_state).metanext != L'\0') {
              (el->el_state).metanext = L'\0';
              local_4c = local_4c | 0x80;
            }
            uVar11 = 9;
            if (local_4c < L'Ā') {
              uVar11 = (el->el_map).current[(uint)(local_4c & 0xff)];
            }
            if (uVar11 == 0x19) {
              wVar6 = keymacro_get(el,&local_4c,&local_40);
              if (wVar6 == L'\x02') {
                bVar4 = false;
              }
              else if (wVar6 == L'\x01') {
                el_wpush(el,(wchar_t *)CONCAT71(local_40._1_7_,local_40.cmd));
                bVar4 = true;
              }
              else {
                if (wVar6 != L'\0') {
                  abort();
                }
                bVar4 = true;
                uVar11 = local_40.cmd;
              }
              if (!bVar4) goto LAB_0010dbd3;
            }
            if (uVar11 == 0x19) goto switchD_0010dc9c_caseD_3;
            bVar3 = false;
            bVar10 = uVar11;
          }
LAB_0010dbd3:
          if (bVar3) {
            wVar6 = L'\xffffffff';
LAB_0010dda6:
            terminal__flush(el);
            if ((el->el_flags & L'\b') == L'\0') {
              read_finish(el);
              wVar8 = L'\0';
              if (wVar6 != L'\xffffffff') {
                wVar8 = wVar6;
              }
            }
            else {
              wVar8 = (wchar_t)((ulong)((long)(el->el_line).lastchar - (long)(el->el_line).buffer)
                               >> 2);
            }
            *local_48 = wVar8;
            if (wVar8 != L'\0') {
              return (el->el_line).buffer;
            }
            if (wVar6 == L'\xffffffff') {
              *local_48 = L'\xffffffff';
              wVar6 = el->el_read->read_errno;
              if (wVar6 != L'\0') {
                pwVar9 = __errno_location();
                *pwVar9 = wVar6;
              }
            }
            return (wchar_t *)0x0;
          }
        } while ((el->el_map).nfunc <= (ulong)bVar10);
        (el->el_state).thiscmd = bVar10;
        (el->el_state).thisch = local_4c;
        if ((((el->el_map).type == L'\x01') && ((el->el_map).current == (el->el_map).key)) &&
           (pwVar9 = (el->el_chared).c_redo.pos, pwVar9 < (el->el_chared).c_redo.lim)) {
          if (((bVar10 == 0x3a) && (pwVar9 != (el->el_chared).c_redo.buf)) &&
             (iVar7 = iswprint(pwVar9[-1]), iVar7 != 0)) {
            ppwVar1 = &(el->el_chared).c_redo.pos;
            *ppwVar1 = *ppwVar1 + -1;
          }
          else {
            pwVar9 = (el->el_chared).c_redo.pos;
            (el->el_chared).c_redo.pos = pwVar9 + 1;
            *pwVar9 = local_4c;
          }
        }
        eVar5 = (*(el->el_map).func[bVar10])(el,local_4c);
        (el->el_state).lastcmd = bVar10;
        wVar6 = L'\xffffffff';
        switch(eVar5) {
        case '\0':
          break;
        case '\x01':
          wVar6 = (wchar_t)((ulong)((long)(el->el_line).lastchar - (long)(el->el_line).buffer) >> 2)
          ;
          break;
        case '\x02':
          wVar6 = L'\0';
          if ((el->el_flags & L'\b') != L'\0') {
            pwVar2 = (el->el_line).lastchar;
            pwVar9 = pwVar2 + 1;
            (el->el_line).lastchar = pwVar9;
            *pwVar2 = L'\x04';
            (el->el_line).cursor = pwVar9;
            wVar6 = L'\x01';
          }
          break;
        case '\x03':
          goto switchD_0010dc9c_caseD_3;
        case '\x04':
          goto switchD_0010dc9c_caseD_4;
        case '\x05':
          re_refresh_cursor(el);
          break;
        default:
          terminal_beep(el);
          terminal__flush(el);
          break;
        case '\a':
          re_clear_display(el);
          ch_reset(el);
          read_clearmacros(&el->el_read->macros);
          goto switchD_0010dc9c_caseD_4;
        case '\b':
          re_clear_lines(el);
          re_clear_display(el);
switchD_0010dc9c_caseD_4:
          re_refresh(el);
          break;
        case '\t':
          re_refresh(el);
          terminal_beep(el);
        }
        (el->el_state).doingarg = L'\0';
        (el->el_state).argument = L'\x01';
        (el->el_chared).c_vcmd.action = L'\0';
        if (((el->el_flags & L'\b') != L'\0') || (wVar6 != L'\xffffffff')) goto LAB_0010dda6;
      } while( true );
    }
    if ((el->el_flags & 8U) == 0) {
      (el->el_line).lastchar = (el->el_line).buffer;
    }
    terminal__flush(el);
  }
  else {
    (el->el_line).lastchar = (el->el_line).buffer;
  }
  pwVar9 = noedit_wgets(el,pwVar9);
  return pwVar9;
}

Assistant:

const wchar_t *
el_wgets(EditLine *el, int *nread)
{
	int retval;
	el_action_t cmdnum = 0;
	int num;		/* how many chars we have read at NL */
	wchar_t ch;
	int nrb;

	if (nread == NULL)
		nread = &nrb;
	*nread = 0;
	el->el_read->read_errno = 0;

	if (el->el_flags & NO_TTY) {
		el->el_line.lastchar = el->el_line.buffer;
		return noedit_wgets(el, nread);
	}

#ifdef FIONREAD
	if (el->el_tty.t_mode == EX_IO && el->el_read->macros.level < 0) {
		int chrs = 0;

		(void) ioctl(el->el_infd, FIONREAD, &chrs);
		if (chrs == 0) {
			if (tty_rawmode(el) < 0) {
				errno = 0;
				*nread = 0;
				return NULL;
			}
		}
	}
#endif /* FIONREAD */

	if ((el->el_flags & UNBUFFERED) == 0)
		read_prepare(el);

	if (el->el_flags & EDIT_DISABLED) {
		if ((el->el_flags & UNBUFFERED) == 0)
			el->el_line.lastchar = el->el_line.buffer;
		terminal__flush(el);
		return noedit_wgets(el, nread);
	}

	for (num = -1; num == -1;) {  /* while still editing this line */
		/* if EOF or error */
		if (read_getcmd(el, &cmdnum, &ch) == -1)
			break;
		if ((size_t)cmdnum >= el->el_map.nfunc) /* BUG CHECK command */
			continue;	/* try again */
		/* now do the real command */
		/* vi redo needs these way down the levels... */
		el->el_state.thiscmd = cmdnum;
		el->el_state.thisch = ch;
		if (el->el_map.type == MAP_VI &&
		    el->el_map.current == el->el_map.key &&
		    el->el_chared.c_redo.pos < el->el_chared.c_redo.lim) {
			if (cmdnum == VI_DELETE_PREV_CHAR &&
			    el->el_chared.c_redo.pos != el->el_chared.c_redo.buf
			    && iswprint(el->el_chared.c_redo.pos[-1]))
				el->el_chared.c_redo.pos--;
			else
				*el->el_chared.c_redo.pos++ = ch;
		}
		retval = (*el->el_map.func[cmdnum]) (el, ch);

		/* save the last command here */
		el->el_state.lastcmd = cmdnum;

		/* use any return value */
		switch (retval) {
		case CC_CURSOR:
			re_refresh_cursor(el);
			break;

		case CC_REDISPLAY:
			re_clear_lines(el);
			re_clear_display(el);
			/* FALLTHROUGH */

		case CC_REFRESH:
			re_refresh(el);
			break;

		case CC_REFRESH_BEEP:
			re_refresh(el);
			terminal_beep(el);
			break;

		case CC_NORM:	/* normal char */
			break;

		case CC_ARGHACK:	/* Suggested by Rich Salz */
			/* <rsalz@pineapple.bbn.com> */
			continue;	/* keep going... */

		case CC_EOF:	/* end of file typed */
			if ((el->el_flags & UNBUFFERED) == 0)
				num = 0;
			else if (num == -1) {
				*el->el_line.lastchar++ = CONTROL('d');
				el->el_line.cursor = el->el_line.lastchar;
				num = 1;
			}
			break;

		case CC_NEWLINE:	/* normal end of line */
			num = (int)(el->el_line.lastchar - el->el_line.buffer);
			break;

		case CC_FATAL:	/* fatal error, reset to known state */
			/* put (real) cursor in a known place */
			re_clear_display(el);	/* reset the display stuff */
			ch_reset(el);	/* reset the input pointers */
			read_clearmacros(&el->el_read->macros);
			re_refresh(el); /* print the prompt again */
			break;

		case CC_ERROR:
		default:	/* functions we don't know about */
			terminal_beep(el);
			terminal__flush(el);
			break;
		}
		el->el_state.argument = 1;
		el->el_state.doingarg = 0;
		el->el_chared.c_vcmd.action = NOP;
		if (el->el_flags & UNBUFFERED)
			break;
	}

	terminal__flush(el);		/* flush any buffered output */
	/* make sure the tty is set up correctly */
	if ((el->el_flags & UNBUFFERED) == 0) {
		read_finish(el);
		*nread = num != -1 ? num : 0;
	} else
		*nread = (int)(el->el_line.lastchar - el->el_line.buffer);

	if (*nread == 0) {
		if (num == -1) {
			*nread = -1;
			if (el->el_read->read_errno)
				errno = el->el_read->read_errno;
		}
		return NULL;
	} else
		return el->el_line.buffer;
}